

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReporterTest.cpp
# Opt level: O0

void __thiscall
jaegertracing::reporters::Reporter_testRemoteReporter_Test::TestBody
          (Reporter_testRemoteReporter_Test *this)

{
  bool bVar1;
  FakeTransport *this_00;
  type pLVar2;
  type pMVar3;
  char *pcVar4;
  AssertHelper local_1c8 [8];
  Message local_1c0 [8];
  size_type local_1b8;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar;
  duration<long,_std::ratio<1L,_1000L>_> local_198;
  int local_190;
  int local_18c;
  int i;
  int kNumReports;
  int local_17c;
  duration<long,_std::ratio<1L,_1000L>_> local_178;
  duration<long,std::ratio<1l,1000000000l>> local_170 [8];
  RemoteReporter local_168 [8];
  RemoteReporter reporter;
  int kFixedQueueSize;
  unique_ptr<jaegertracing::metrics::Metrics,_std::default_delete<jaegertracing::metrics::Metrics>_>
  metrics;
  unique_ptr<jaegertracing::logging::Logger,_std::default_delete<jaegertracing::logging::Logger>_>
  local_58;
  unique_ptr<jaegertracing::logging::Logger,_std::default_delete<jaegertracing::logging::Logger>_>
  logger;
  mutex mutex;
  vector<jaegertracing::Span,_std::allocator<jaegertracing::Span>_> spans;
  Reporter_testRemoteReporter_Test *this_local;
  
  std::vector<jaegertracing::Span,_std::allocator<jaegertracing::Span>_>::vector
            ((vector<jaegertracing::Span,_std::allocator<jaegertracing::Span>_> *)
             &mutex.super___mutex_base._M_mutex.__data.__list.__next);
  std::mutex::mutex((mutex *)&logger);
  jaegertracing::logging::nullLogger();
  jaegertracing::metrics::Metrics::makeNullMetrics();
  local_17c = 1;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_178,&local_17c);
  std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1000l>,void>
            (local_170,&local_178);
  this_00 = (FakeTransport *)operator_new(0x18);
  anon_unknown_0::FakeTransport::FakeTransport
            (this_00,(vector<jaegertracing::Span,_std::allocator<jaegertracing::Span>_> *)
                     &mutex.super___mutex_base._M_mutex.__data.__list.__next,(mutex *)&logger);
  std::unique_ptr<jaegertracing::Sender,std::default_delete<jaegertracing::Sender>>::
  unique_ptr<std::default_delete<jaegertracing::Sender>,void>
            ((unique_ptr<jaegertracing::Sender,std::default_delete<jaegertracing::Sender>> *)&i,
             (pointer)this_00);
  pLVar2 = std::
           unique_ptr<jaegertracing::logging::Logger,_std::default_delete<jaegertracing::logging::Logger>_>
           ::operator*(&local_58);
  pMVar3 = std::
           unique_ptr<jaegertracing::metrics::Metrics,_std::default_delete<jaegertracing::metrics::Metrics>_>
           ::operator*((unique_ptr<jaegertracing::metrics::Metrics,_std::default_delete<jaegertracing::metrics::Metrics>_>
                        *)&stack0xffffffffffffff90);
  jaegertracing::reporters::RemoteReporter::RemoteReporter
            (local_168,(duration *)local_170,10,(unique_ptr *)&i,pLVar2,pMVar3);
  std::unique_ptr<jaegertracing::Sender,_std::default_delete<jaegertracing::Sender>_>::~unique_ptr
            ((unique_ptr<jaegertracing::Sender,_std::default_delete<jaegertracing::Sender>_> *)&i);
  local_18c = 100;
  for (local_190 = 0; local_190 < 100; local_190 = local_190 + 1) {
    jaegertracing::reporters::RemoteReporter::report((Span *)local_168);
    gtest_ar.message_.ptr_._4_4_ = 1;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1000l>> *)&local_198,
               (int *)((long)&gtest_ar.message_.ptr_ + 4));
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_198);
  }
  jaegertracing::reporters::RemoteReporter::close();
  local_1b8 = std::vector<jaegertracing::Span,_std::allocator<jaegertracing::Span>_>::size
                        ((vector<jaegertracing::Span,_std::allocator<jaegertracing::Span>_> *)
                         &mutex.super___mutex_base._M_mutex.__data.__list.__next);
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_1b0,"spans.size()","kNumReports",&local_1b8,&local_18c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
  if (!bVar1) {
    testing::Message::Message(local_1c0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
    testing::internal::AssertHelper::AssertHelper
              (local_1c8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/reporters/ReporterTest.cpp"
               ,0x51,pcVar4);
    testing::internal::AssertHelper::operator=(local_1c8,local_1c0);
    testing::internal::AssertHelper::~AssertHelper(local_1c8);
    testing::Message::~Message(local_1c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
  RemoteReporter::~RemoteReporter(local_168);
  std::
  unique_ptr<jaegertracing::metrics::Metrics,_std::default_delete<jaegertracing::metrics::Metrics>_>
  ::~unique_ptr((unique_ptr<jaegertracing::metrics::Metrics,_std::default_delete<jaegertracing::metrics::Metrics>_>
                 *)&stack0xffffffffffffff90);
  std::
  unique_ptr<jaegertracing::logging::Logger,_std::default_delete<jaegertracing::logging::Logger>_>::
  ~unique_ptr(&local_58);
  std::vector<jaegertracing::Span,_std::allocator<jaegertracing::Span>_>::~vector
            ((vector<jaegertracing::Span,_std::allocator<jaegertracing::Span>_> *)
             &mutex.super___mutex_base._M_mutex.__data.__list.__next);
  return;
}

Assistant:

TEST(Reporter, testRemoteReporter)
{
    std::vector<Span> spans;
    std::mutex mutex;
    auto logger = logging::nullLogger();
    auto metrics = metrics::Metrics::makeNullMetrics();
    constexpr auto kFixedQueueSize = 10;
    RemoteReporter reporter(
        std::chrono::milliseconds(1),
        kFixedQueueSize,
        std::unique_ptr<Sender>(new FakeTransport(spans, mutex)),
        *logger,
        *metrics);
    constexpr auto kNumReports = 100;
    for (auto i = 0; i < kNumReports; ++i) {
        reporter.report(span);
        // TODO(isaachier): Find a way to make this test more rigorous.
        std::this_thread::sleep_for(std::chrono::milliseconds(1));
    }
    reporter.close();
    ASSERT_EQ(spans.size(), kNumReports);
}